

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O2

void __thiscall
ScriptMemoryDumper::DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
          (ScriptMemoryDumper *this,uint index,
          HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket)

{
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *pSVar1;
  
  pSVar1 = &heapBucket->allocatorHead;
  do {
    DumpSmallHeapBlock<MediumAllocationBlockAttributes>
              (this,&pSVar1->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    pSVar1 = pSVar1->next;
  } while (pSVar1 != &heapBucket->allocatorHead);
  Memory::HeapBlockList::
  ForEach<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>,ScriptMemoryDumper::DumpSmallHeapBlockList<MediumAllocationBlockAttributes>(Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (&heapBucket->fullBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,
             (anon_class_8_1_8991fb9c)this);
  Memory::HeapBlockList::
  ForEach<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>,ScriptMemoryDumper::DumpSmallHeapBlockList<MediumAllocationBlockAttributes>(Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (&heapBucket->heapBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,
             (anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void ScriptMemoryDumper::DumpHeapBucket(uint index, HeapBucketT<TBlockType>* heapBucket)
{
    SmallHeapBlockAllocator<TBlockType> * currentAllocator = heapBucket->GetAllocator();
    do
    {
        DumpSmallHeapBlock(currentAllocator->GetHeapBlock());
        currentAllocator = currentAllocator->GetNext();
    }
    while (currentAllocator != heapBucket->GetAllocator());

    DumpSmallHeapBlockList(heapBucket->fullBlockList);
    DumpSmallHeapBlockList(heapBucket->heapBlockList);
}